

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  _Rb_tree_node_base *key;
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  cmake *pcVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  ostringstream e;
  string local_1c0;
  string local_1a0 [11];
  
  __lhs = &this->PropertyName;
  bVar1 = std::operator==(__lhs,"ADVANCED");
  if (bVar1) {
    if ((this->Remove == false) &&
       (bVar1 = cmSystemTools::IsOn((this->PropertyValue)._M_dataplus._M_p), !bVar1)) {
      bVar1 = cmSystemTools::IsOff((this->PropertyValue)._M_dataplus._M_p);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        poVar2 = std::operator<<((ostream *)local_1a0,"given non-boolean value \"");
        poVar2 = std::operator<<(poVar2,(string *)&this->PropertyValue);
        std::operator<<(poVar2,"\" for CACHE property \"ADVANCED\".  ");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1c0);
        goto LAB_002ca47e;
      }
    }
  }
  else {
    bVar1 = std::operator==(__lhs,"TYPE");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)local_1a0,(this->PropertyValue)._M_dataplus._M_p,(allocator *)&local_1c0)
      ;
      bVar1 = cmState::IsCacheEntryType(local_1a0);
      std::__cxx11::string::~string((string *)local_1a0);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        poVar2 = std::operator<<((ostream *)local_1a0,"given invalid CACHE entry TYPE \"");
        poVar2 = std::operator<<(poVar2,(string *)&this->PropertyValue);
        std::operator<<(poVar2,"\"");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1c0);
        goto LAB_002ca47e;
      }
    }
    else {
      bVar1 = std::operator!=(__lhs,"HELPSTRING");
      if (((bVar1) && (bVar1 = std::operator!=(__lhs,"STRINGS"), bVar1)) &&
         (bVar1 = std::operator!=(__lhs,"VALUE"), bVar1)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        poVar2 = std::operator<<((ostream *)local_1a0,"given invalid CACHE property ");
        poVar2 = std::operator<<(poVar2,(string *)__lhs);
        poVar2 = std::operator<<(poVar2,".  ");
        poVar2 = std::operator<<(poVar2,"Settable CACHE properties are: ");
        std::operator<<(poVar2,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.");
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_1c0);
        goto LAB_002ca47e;
      }
    }
  }
  p_Var5 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var5 == &(this->Names)._M_t._M_impl.super__Rb_tree_header) {
      return true;
    }
    pcVar3 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    key = p_Var5 + 1;
    pcVar4 = cmState::GetCacheEntryValue(pcVar3->State,(string *)key);
    if (pcVar4 == (char *)0x0) break;
    HandleCacheEntry(this,(string *)key);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar2 = std::operator<<((ostream *)local_1a0,"could not find CACHE variable ");
  poVar2 = std::operator<<(poVar2,(string *)key);
  std::operator<<(poVar2,".  Perhaps it has not yet been created.");
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(&this->super_cmCommand,&local_1c0);
LAB_002ca47e:
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if(this->PropertyName == "ADVANCED")
    {
    if(!this->Remove &&
       !cmSystemTools::IsOn(this->PropertyValue.c_str()) &&
       !cmSystemTools::IsOff(this->PropertyValue.c_str()))
      {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << "\" for CACHE property \"ADVANCED\".  ";
      this->SetError(e.str());
      return false;
      }
    }
  else if(this->PropertyName == "TYPE")
    {
    if(!cmState::IsCacheEntryType(this->PropertyValue.c_str()))
      {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
      }
    }
  else if(this->PropertyName != "HELPSTRING" &&
          this->PropertyName != "STRINGS" &&
          this->PropertyName != "VALUE")
    {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
    }

  for(std::set<std::string>::const_iterator ni = this->Names.begin();
      ni != this->Names.end(); ++ni)
    {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue
                          = cm->GetState()->GetCacheEntryValue(*ni);
    if(existingValue)
      {
      if(!this->HandleCacheEntry(*ni))
        {
        return false;
        }
      }
    else
      {
      std::ostringstream e;
      e << "could not find CACHE variable " << *ni
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
      }
    }
  return true;
}